

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

RPCManagerPtr * miniros::RPCManager::instance(void)

{
  int iVar1;
  
  if (instance()::xmlrpc_manager == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::xmlrpc_manager);
    if (iVar1 != 0) {
      std::make_shared<miniros::RPCManager>();
      __cxa_atexit(std::__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr
                   ,&instance::xmlrpc_manager,&__dso_handle);
      __cxa_guard_release(&instance()::xmlrpc_manager);
    }
  }
  return &instance::xmlrpc_manager;
}

Assistant:

const RPCManagerPtr& RPCManager::instance()
{
  static RPCManagerPtr xmlrpc_manager = std::make_shared<RPCManager>();
  return xmlrpc_manager;
}